

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

matrix sptk::swipe::nansm(int xSz,int ySz)

{
  matrix mVar1;
  int j;
  int i;
  matrix nw_matrix;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  int in_stack_ffffffffffffffe4;
  int iVar3;
  int local_10;
  int iStack_c;
  double **local_8;
  
  mVar1 = makem(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  for (iVar3 = 0; local_10 = mVar1.x, iVar3 < local_10; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iStack_c = mVar1.y, iVar2 < iStack_c; iVar2 = iVar2 + 1) {
      local_8 = mVar1.m;
      local_8[iVar3][iVar2] = NAN;
    }
  }
  return mVar1;
}

Assistant:

matrix nansm(int xSz, int ySz) {
    matrix nw_matrix = makem(xSz, ySz);
    int i, j;
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = NAN;
    return(nw_matrix);
}